

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMPointsToSet.h
# Opt level: O2

void __thiscall dg::DGLLVMPointsToSet::DGLLVMPointsToSet(DGLLVMPointsToSet *this,PointsToSetT *S)

{
  LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>::LLVMPointsToSetImplTemplate
            (&this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>,S);
  (this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).
  super_LLVMPointsToSetImpl._vptr_LLVMPointsToSetImpl = (_func_int **)&PTR_hasUnknown_001267f0;
  LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>::initialize_iterator
            (&this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>);
  return;
}

Assistant:

DGLLVMPointsToSet(const PointsToSetT &S) : LLVMPointsToSetImplTemplate(S) {
        initialize_iterator();
    }